

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compositecodec.h
# Opt level: O0

void __thiscall
FastPForLib::
CompositeCodec<FastPForLib::SimplePFor<FastPForLib::Simple8b<true>_>,_FastPForLib::VariableByte>::
_encodeArray<unsigned_int>
          (CompositeCodec<FastPForLib::SimplePFor<FastPForLib::Simple8b<true>_>,_FastPForLib::VariableByte>
           *this,uint *in,size_t length,uint32_t *out,size_t *nvalue)

{
  ulong uVar1;
  size_t *nvalue_00;
  logic_error *this_00;
  VariableByte *this_01;
  size_t in_RCX;
  size_t *in_RDX;
  SimplePFor<FastPForLib::Simple8b<true>_> *in_RSI;
  uint32_t *in_RDI;
  ulong *in_R8;
  size_t nvalue2;
  size_t nvalue1;
  size_t roundedlength;
  uint32_t *in_stack_ffffffffffffff98;
  size_t in_stack_ffffffffffffffa0;
  
  if (*in_R8 != 0) {
    nvalue_00 = (size_t *)((ulong)in_RDX & 0xffffffffffffff80);
    uVar1 = *in_R8;
    SimplePFor<FastPForLib::Simple8b<true>_>::encodeArray
              (in_RSI,(uint32_t *)in_RDX,in_RCX,(uint32_t *)in_R8,nvalue_00);
    if (nvalue_00 < in_RDX) {
      if (*in_R8 < uVar1) {
        this_00 = (logic_error *)__cxa_allocate_exception(0x10);
        std::logic_error::logic_error
                  (this_00,"Encode run over output buffer. Potential buffer overflow!");
        __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
      this_01 = (VariableByte *)(*in_R8 - uVar1);
      VariableByte::encodeArray
                (this_01,in_RDI,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
                 (size_t *)0x13c86d);
      *in_R8 = (long)&(this_01->super_IntegerCODEC)._vptr_IntegerCODEC + uVar1;
    }
    else {
      *in_R8 = uVar1;
    }
  }
  return;
}

Assistant:

void _encodeArray(const IntType *in, const size_t length, uint32_t *out,
                    size_t &nvalue) {
    if (nvalue == 0) {
      return;
    }
    const size_t roundedlength = length / Codec1::BlockSize * Codec1::BlockSize;
    size_t nvalue1 = nvalue;
    codec1.encodeArray(in, roundedlength, out, nvalue1);

    if (roundedlength < length) {
      if (nvalue1 > nvalue) {
        throw std::logic_error(
            "Encode run over output buffer. Potential buffer overflow!");
      }
      size_t nvalue2 = nvalue - nvalue1;
      codec2.encodeArray(in + roundedlength, length - roundedlength,
                         out + nvalue1, nvalue2);
      nvalue = nvalue1 + nvalue2;
    } else {
      nvalue = nvalue1;
    }
  }